

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ExprCacheClear(Parse *pParse)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  
  bVar1 = pParse->nColCache;
  piVar4 = &pParse->aColCache[0].iReg;
  for (uVar5 = 0; uVar5 < bVar1; uVar5 = uVar5 + 1) {
    if (*(u8 *)((long)piVar4 + -6) != '\0') {
      bVar2 = pParse->nTempReg;
      if ((ulong)bVar2 < 8) {
        iVar3 = *piVar4;
        pParse->nTempReg = bVar2 + 1;
        pParse->aTempReg[bVar2] = iVar3;
      }
    }
    piVar4 = piVar4 + 5;
  }
  pParse->nColCache = '\0';
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCacheClear(Parse *pParse){
  int i;

#ifdef SQLITE_DEBUG
  if( pParse->db->flags & SQLITE_VdbeAddopTrace ){
    printf("CLEAR\n");
  }
#endif
  for(i=0; i<pParse->nColCache; i++){
    if( pParse->aColCache[i].tempReg
     && pParse->nTempReg<ArraySize(pParse->aTempReg)
    ){
       pParse->aTempReg[pParse->nTempReg++] = pParse->aColCache[i].iReg;
    }
  }
  pParse->nColCache = 0;
}